

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_partial_sig_load
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_musig_partial_sig *sig)

{
  long lVar1;
  int overflow;
  int local_4;
  
  lVar1 = 0;
  do {
    if (sig->data[lVar1] != secp256k1_musig_partial_sig_magic[lVar1]) {
      (*(ctx->illegal_callback).fn)
                ("secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0",
                 (ctx->illegal_callback).data);
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  secp256k1_scalar_set_b32(s,sig->data + 4,&local_4);
  return 1;
}

Assistant:

static int secp256k1_musig_partial_sig_load(const secp256k1_context* ctx, secp256k1_scalar *s, const secp256k1_musig_partial_sig* sig) {
    int overflow;

    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);
    secp256k1_scalar_set_b32(s, &sig->data[4], &overflow);
    /* Parsed signatures can not overflow */
    VERIFY_CHECK(!overflow);
    return 1;
}